

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kf_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_8b4be9::KeyFrameIntervalTestLarge_KeyFrameIntervalTest_Test::TestBody
          (KeyFrameIntervalTestLarge_KeyFrameIntervalTest_Test *this)

{
  EncoderTest *pEVar1;
  undefined8 *puVar2;
  bool bVar3;
  pointer *__ptr;
  SEARCH_METHODS *message;
  AssertHelper local_a8;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  AssertHelper local_80;
  I420VideoSource video;
  
  gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
  _vptr_TestPartResultReporterInterface =
       (_func_int **)&gtest_fatal_failure_checker.original_reporter_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_fatal_failure_checker,"hantro_collage_w352h288.yuv","");
  libaom_test::YUVVideoSource::YUVVideoSource
            (&video.super_YUVVideoSource,(string *)&gtest_fatal_failure_checker,AOM_IMG_FMT_I420,
             0x160,0x120,
             (this->super_KeyFrameIntervalTestLarge).super_EncoderTest.cfg_.g_timebase.den,
             (this->super_KeyFrameIntervalTestLarge).super_EncoderTest.cfg_.g_timebase.num,0,0x4b);
  video.super_YUVVideoSource.super_VideoSource._vptr_VideoSource =
       (_func_int **)&PTR__YUVVideoSource_01003b10;
  if ((TestPartResultReporterInterface **)
      gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
      _vptr_TestPartResultReporterInterface != &gtest_fatal_failure_checker.original_reporter_) {
    operator_delete(gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                    _vptr_TestPartResultReporterInterface);
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      pEVar1 = &(this->super_KeyFrameIntervalTestLarge).super_EncoderTest;
      (*pEVar1->_vptr_EncoderTest[2])(pEVar1,&video);
    }
    bVar3 = gtest_fatal_failure_checker.has_new_fatal_failure_;
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    if (bVar3 == false) {
      local_a8.data_._0_1_ = 0;
      testing::internal::CmpHelperEQ<bool,bool>
                ((internal *)&gtest_fatal_failure_checker,"is_kf_interval_violated_","false",
                 &(this->super_KeyFrameIntervalTestLarge).is_kf_interval_violated_,(bool *)&local_a8
                );
      if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                _vptr_TestPartResultReporterInterface == '\0') {
        testing::Message::Message((Message *)&local_a8);
        anon_unknown.dwarf_8b4be9::operator<<
                  ((ostream *)(CONCAT71(local_a8.data_._1_7_,local_a8.data_._0_1_) + 0x10),
                   &(this->super_KeyFrameIntervalTestLarge).kf_dist_param_);
        if ((undefined8 *)
            CONCAT71(gtest_fatal_failure_checker._9_7_,
                     gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
          message = "";
        }
        else {
          message = *(SEARCH_METHODS **)
                     CONCAT71(gtest_fatal_failure_checker._9_7_,
                              gtest_fatal_failure_checker.has_new_fatal_failure_);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/kf_test.cc"
                   ,0xdd,(char *)message);
        testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_a8);
        testing::internal::AssertHelper::~AssertHelper(&local_80);
        if ((long *)CONCAT71(local_a8.data_._1_7_,local_a8.data_._0_1_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(local_a8.data_._1_7_,local_a8.data_._0_1_) + 8))();
        }
      }
      puVar2 = (undefined8 *)
               CONCAT71(gtest_fatal_failure_checker._9_7_,
                        gtest_fatal_failure_checker.has_new_fatal_failure_);
      if (puVar2 != (undefined8 *)0x0) {
        if ((undefined8 *)*puVar2 != puVar2 + 2) {
          operator_delete((undefined8 *)*puVar2);
        }
        operator_delete(puVar2);
      }
      goto LAB_004cd61b;
    }
  }
  testing::Message::Message((Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::AssertHelper
            (&local_a8,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/kf_test.cc"
             ,0xdc,
             "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=(&local_a8,(Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::~AssertHelper(&local_a8);
  if (gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
      _vptr_TestPartResultReporterInterface != (_func_int **)0x0) {
    (**(code **)(*gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface + 8))();
  }
LAB_004cd61b:
  libaom_test::YUVVideoSource::~YUVVideoSource(&video.super_YUVVideoSource);
  return;
}

Assistant:

TEST_P(KeyFrameIntervalTestLarge, KeyFrameIntervalTest) {
  libaom_test::I420VideoSource video(TestFileName(), TestFileWidth(),
                                     TestFileHeight(), cfg_.g_timebase.den,
                                     cfg_.g_timebase.num, 0, 75);
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
  ASSERT_EQ(is_kf_interval_violated_, false) << kf_dist_param_;
}